

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::DisposableOwnedBundle<kj::Own<kj::HttpServer::Connection>,_kj::Own<kj::HttpService>_>::
disposeImpl(DisposableOwnedBundle<kj::Own<kj::HttpServer::Connection>,_kj::Own<kj::HttpService>_>
            *this,void *pointer)

{
  Connection *pCVar1;
  Disposer *pDVar2;
  HttpService *pHVar3;
  
  pCVar1 = (this->super_OwnedBundle<kj::Own<kj::HttpServer::Connection>,_kj::Own<kj::HttpService>_>)
           .first.ptr;
  if (pCVar1 != (Connection *)0x0) {
    (this->super_OwnedBundle<kj::Own<kj::HttpServer::Connection>,_kj::Own<kj::HttpService>_>).first.
    ptr = (Connection *)0x0;
    pDVar2 = (this->
             super_OwnedBundle<kj::Own<kj::HttpServer::Connection>,_kj::Own<kj::HttpService>_>).
             first.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pCVar1->super_Response)._vptr_Response[-2] +
                      (long)&(pCVar1->super_Response)._vptr_Response);
  }
  pHVar3 = (this->super_OwnedBundle<kj::Own<kj::HttpServer::Connection>,_kj::Own<kj::HttpService>_>)
           .super_OwnedBundle<kj::Own<kj::HttpService>_>.first.ptr;
  if (pHVar3 != (HttpService *)0x0) {
    (this->super_OwnedBundle<kj::Own<kj::HttpServer::Connection>,_kj::Own<kj::HttpService>_>).
    super_OwnedBundle<kj::Own<kj::HttpService>_>.first.ptr = (HttpService *)0x0;
    pDVar2 = (this->
             super_OwnedBundle<kj::Own<kj::HttpServer::Connection>,_kj::Own<kj::HttpService>_>).
             super_OwnedBundle<kj::Own<kj::HttpService>_>.first.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pHVar3->_vptr_HttpService[-2] + (long)&pHVar3->_vptr_HttpService);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override { delete this; }